

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlattribute.cpp
# Opt level: O0

string * __thiscall
libcellml::XmlAttribute::namespacePrefix_abi_cxx11_
          (string *__return_storage_ptr__,XmlAttribute *this)

{
  xmlChar *__s;
  allocator<char> local_19;
  XmlAttribute *local_18;
  XmlAttribute *this_local;
  
  local_18 = this;
  this_local = (XmlAttribute *)__return_storage_ptr__;
  if (this->mPimpl->mXmlAttributePtr->ns == (xmlNs *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    __s = this->mPimpl->mXmlAttributePtr->ns->prefix;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)__s,&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string XmlAttribute::namespacePrefix() const
{
    if (mPimpl->mXmlAttributePtr->ns == nullptr) {
        return {};
    }
    return reinterpret_cast<const char *>(mPimpl->mXmlAttributePtr->ns->prefix);
}